

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O2

void __thiscall
FDrawInfo::DrawFloodedPlane(FDrawInfo *this,wallseg *ws,float planez,sector_t *sec,bool ceiling)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  FDynamicColormap *pFVar5;
  FMaterial *mat;
  undefined7 in_register_00000009;
  int sectorlightlevel;
  int iVar6;
  float fVar7;
  float fVar8;
  FColormap local_138;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  undefined8 uStack_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  FQuadDrawer qd;
  GLSectorPlane plane;
  
  GLSectorPlane::GetFromSector(&plane,sec,(int)CONCAT71(in_register_00000009,ceiling));
  mat = FMaterial::ValidateTexture(plane.texture,false,true);
  if (mat == (FMaterial *)0x0) {
    return;
  }
  if (gl_fixedcolormap == 0) {
    pFVar5 = sec->ColorMap;
    local_138.LightColor.field_0 = (pFVar5->Color).field_0;
    local_138.FadeColor.field_0 = (pFVar5->Fade).field_0;
    local_138._8_8_ = CONCAT44(local_138._3_4_,pFVar5->Desaturate) & 0xffffffffff;
    if (((mat->tex->gl_info).field_0x4c & 8) == 0) {
      if (ceiling) {
        iVar6 = sector_t::GetCeilingLight(sec);
      }
      else {
        iVar6 = sector_t::GetFloorLight(sec);
      }
      sectorlightlevel = -iVar6;
      if (0 < iVar6) {
        sectorlightlevel = iVar6;
      }
      goto LAB_003ea11b;
    }
    local_138.LightColor.field_0.d._0_3_ = 0xffffff;
  }
  else {
    local_138.LightColor.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)0xffffff;
    local_138.FadeColor.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)0x0;
    local_138.desaturation = 0;
    local_138.blendfactor = 0;
  }
  sectorlightlevel = 0xff;
LAB_003ea11b:
  iVar6 = gl_weaponlight.Value * extralight;
  gl_SetColor(sectorlightlevel,iVar6,&local_138,1.0,false);
  gl_SetFog(sectorlightlevel,iVar6,&local_138,false);
  FRenderState::SetMaterial(&gl_RenderState,mat,0,0,-1,false);
  local_128 = (float)ViewPos.Z;
  _local_118 = ZEXT416((uint)(planez - local_128));
  local_108 = (float)ViewPos.X;
  fStack_104 = (float)ViewPos.Y;
  uStack_100 = 0;
  gl_SetPlaneTextureRotation(&plane,mat);
  FRenderState::Apply(&gl_RenderState);
  fStack_124 = (float)local_118._0_4_ / (ws->z1 - local_128);
  fVar8 = (float)local_118._0_4_ / (ws->z2 - local_128);
  uVar1 = ws->x1;
  uVar3 = ws->y1;
  local_c8 = ((float)uVar1 - local_108) * fStack_124 + local_108;
  fStack_c4 = ((float)uVar3 - fStack_104) * fStack_124 + fStack_104;
  fStack_c0 = (0.0 - (float)uStack_100) * fStack_124 + (float)uStack_100;
  fStack_bc = (0.0 - uStack_100._4_4_) * fStack_124 + uStack_100._4_4_;
  local_98 = local_c8 * 0.015625;
  fStack_94 = fStack_c4 * -0.015625;
  fStack_90 = fStack_c0 * 0.0;
  fStack_8c = fStack_bc * 0.0;
  local_e8 = ((float)uVar1 - local_108) * fVar8 + local_108;
  local_f8 = ((float)uVar3 - fStack_104) * fVar8 + fStack_104;
  fStack_e0 = (0.0 - (float)uStack_100) * fVar8 + (float)uStack_100;
  fStack_dc = (0.0 - uStack_100._4_4_) * fVar8 + uStack_100._4_4_;
  local_d8 = local_e8 * 0.015625;
  fStack_d4 = local_f8 * -0.015625;
  fStack_d0 = fStack_e0 * 0.0;
  fStack_cc = fStack_dc * 0.0;
  uVar2 = ws->x2;
  uVar4 = ws->y2;
  local_b8 = (float)uVar2 - local_108;
  fStack_b4 = (float)uVar4 - fStack_104;
  fStack_b0 = 0.0 - (float)uStack_100;
  fStack_ac = 0.0 - uStack_100._4_4_;
  local_118._4_4_ = fVar8 * fStack_b4 + fStack_104;
  local_118._0_4_ = fVar8 * local_b8 + local_108;
  fStack_110 = fVar8 * fStack_b0 + (float)uStack_100;
  fStack_10c = fVar8 * fStack_ac + uStack_100._4_4_;
  local_128 = fStack_124;
  fStack_120 = fStack_124;
  fStack_11c = fStack_124;
  fStack_f4 = local_f8;
  fStack_f0 = local_f8;
  fStack_ec = local_f8;
  fStack_e4 = local_f8;
  local_a8 = fStack_c4;
  fStack_a4 = fStack_c4;
  fStack_a0 = fStack_c4;
  fStack_9c = fStack_c4;
  FQuadDrawer::FQuadDrawer(&qd);
  (qd.p)->x = local_c8;
  (qd.p)->z = planez;
  (qd.p)->y = local_a8;
  (qd.p)->u = local_98;
  (qd.p)->v = fStack_94;
  qd.p[1].z = planez;
  qd.p[1].x = local_e8;
  qd.p[1].y = local_f8;
  qd.p[1].u = local_d8;
  qd.p[1].v = fStack_d4;
  qd.p[2].x = (float)local_118._0_4_;
  qd.p[2].z = planez;
  qd.p[2].y = (float)local_118._4_4_;
  qd.p[2].u = (float)local_118._0_4_ * 0.015625;
  qd.p[2].v = (float)local_118._4_4_ * -0.015625;
  qd.p[3].z = planez;
  fVar8 = local_b8 * local_128 + local_108;
  fVar7 = fStack_b4 * fStack_124 + fStack_104;
  qd.p[3].x = fVar8;
  qd.p[3].y = fVar7;
  qd.p[3].u = fVar8 * 0.015625;
  qd.p[3].v = fVar7 * -0.015625;
  FQuadDrawer::Render(&qd,6);
  gl_RenderState.mTextureMatrixEnabled = false;
  return;
}

Assistant:

void FDrawInfo::DrawFloodedPlane(wallseg * ws, float planez, sector_t * sec, bool ceiling)
{
	GLSectorPlane plane;
	int lightlevel;
	FColormap Colormap;
	FMaterial * gltexture;

	plane.GetFromSector(sec, ceiling);

	gltexture=FMaterial::ValidateTexture(plane.texture, false, true);
	if (!gltexture) return;

	if (gl_fixedcolormap) 
	{
		Colormap.Clear();
		lightlevel=255;
	}
	else
	{
		Colormap=sec->ColorMap;
		if (gltexture->tex->isFullbright())
		{
			Colormap.LightColor.r = Colormap.LightColor.g = Colormap.LightColor.b = 0xff;
			lightlevel=255;
		}
		else lightlevel=abs(ceiling? sec->GetCeilingLight() : sec->GetFloorLight());
	}

	int rel = getExtraLight();
	gl_SetColor(lightlevel, rel, Colormap, 1.0f);
	gl_SetFog(lightlevel, rel, &Colormap, false);
	gl_RenderState.SetMaterial(gltexture, CLAMP_NONE, 0, -1, false);

	float fviewx = ViewPos.X;
	float fviewy = ViewPos.Y;
	float fviewz = ViewPos.Z;

	gl_SetPlaneTextureRotation(&plane, gltexture);
	gl_RenderState.Apply();

	float prj_fac1 = (planez-fviewz)/(ws->z1-fviewz);
	float prj_fac2 = (planez-fviewz)/(ws->z2-fviewz);

	float px1 = fviewx + prj_fac1 * (ws->x1-fviewx);
	float py1 = fviewy + prj_fac1 * (ws->y1-fviewy);

	float px2 = fviewx + prj_fac2 * (ws->x1-fviewx);
	float py2 = fviewy + prj_fac2 * (ws->y1-fviewy);

	float px3 = fviewx + prj_fac2 * (ws->x2-fviewx);
	float py3 = fviewy + prj_fac2 * (ws->y2-fviewy);

	float px4 = fviewx + prj_fac1 * (ws->x2-fviewx);
	float py4 = fviewy + prj_fac1 * (ws->y2-fviewy);

	FQuadDrawer qd;
	qd.Set(0, px1, planez, py1, px1 / 64, -py1 / 64);
	qd.Set(1, px2, planez, py2, px2 / 64, -py2 / 64);
	qd.Set(2, px3, planez, py3, px3 / 64, -py3 / 64);
	qd.Set(3, px4, planez, py4, px4 / 64, -py4 / 64);
	qd.Render(GL_TRIANGLE_FAN);

	gl_RenderState.EnableTextureMatrix(false);
}